

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O1

bool __thiscall TCBPoint::operator==(TCBPoint *this,TCBPoint *other)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  bVar1 = qFuzzyCompare(&this->_point,&other->_point);
  if (bVar1) {
    dVar5 = this->_t;
    dVar4 = other->_t;
    uVar2 = -(ulong)(dVar5 < -dVar5);
    dVar6 = dVar5 - dVar4;
    uVar3 = -(ulong)(dVar6 < -dVar6);
    dVar5 = (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2);
    uVar2 = -(ulong)(dVar4 < -dVar4);
    dVar4 = (double)(~uVar2 & (ulong)dVar4 | (ulong)-dVar4 & uVar2);
    if (dVar4 <= dVar5) {
      dVar5 = dVar4;
    }
    if ((double)(~uVar3 & (ulong)dVar6 | (ulong)-dVar6 & uVar3) * 1000000000000.0 <= dVar5) {
      dVar5 = this->_c;
      dVar4 = other->_c;
      uVar2 = -(ulong)(dVar5 < -dVar5);
      dVar6 = dVar5 - dVar4;
      uVar3 = -(ulong)(dVar6 < -dVar6);
      dVar5 = (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2);
      uVar2 = -(ulong)(dVar4 < -dVar4);
      dVar4 = (double)(~uVar2 & (ulong)dVar4 | (ulong)-dVar4 & uVar2);
      if (dVar4 <= dVar5) {
        dVar5 = dVar4;
      }
      if ((double)(~uVar3 & (ulong)dVar6 | (ulong)-dVar6 & uVar3) * 1000000000000.0 <= dVar5) {
        dVar5 = this->_b;
        dVar4 = other->_b;
        uVar2 = -(ulong)(dVar5 < -dVar5);
        dVar6 = dVar5 - dVar4;
        uVar3 = -(ulong)(dVar6 < -dVar6);
        dVar5 = (double)(~uVar2 & (ulong)dVar5 | (ulong)-dVar5 & uVar2);
        uVar2 = -(ulong)(dVar4 < -dVar4);
        dVar4 = (double)(~uVar2 & (ulong)dVar4 | (ulong)-dVar4 & uVar2);
        if (dVar4 <= dVar5) {
          dVar5 = dVar4;
        }
        return (double)(~uVar3 & (ulong)dVar6 | (ulong)-dVar6 & uVar3) * 1000000000000.0 <= dVar5;
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const TCBPoint &other) const
    {
        return _point == other._point &&
                qFuzzyCompare(_t, other._t) &&
                qFuzzyCompare(_c, other._c) &&
                qFuzzyCompare(_b, other._b);
    }